

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O1

int X509V3_EXT_add_nconf_sk(CONF *conf,X509V3_CTX *ctx,char *section,stack_st_X509_EXTENSION **sk)

{
  uint uVar1;
  OPENSSL_STACK *sk_00;
  size_t sVar2;
  void *pvVar3;
  X509_EXTENSION *a;
  stack_st_X509_EXTENSION *psVar4;
  size_t sVar5;
  bool bVar6;
  
  sk_00 = (OPENSSL_STACK *)NCONF_get_section(conf,section);
  if (sk_00 == (OPENSSL_STACK *)0x0) {
    uVar1 = 0;
  }
  else {
    sVar2 = OPENSSL_sk_num(sk_00);
    bVar6 = sVar2 == 0;
    if (!bVar6) {
      sVar2 = 0;
      do {
        pvVar3 = OPENSSL_sk_value(sk_00,sVar2);
        a = X509V3_EXT_nconf(conf,ctx,*(char **)((long)pvVar3 + 8),*(char **)((long)pvVar3 + 0x10));
        if (a == (X509_EXTENSION *)0x0) {
          X509_EXTENSION_free((X509_EXTENSION *)0x0);
          break;
        }
        if (sk == (stack_st_X509_EXTENSION **)0x0) {
          X509_EXTENSION_free(a);
        }
        else {
          psVar4 = X509v3_add_ext(sk,a,-1);
          X509_EXTENSION_free(a);
          if (psVar4 == (stack_st_X509_EXTENSION *)0x0) break;
        }
        sVar2 = sVar2 + 1;
        sVar5 = OPENSSL_sk_num(sk_00);
        bVar6 = sVar2 >= sVar5;
      } while (sVar2 < sVar5);
    }
    uVar1 = (uint)bVar6;
  }
  return uVar1;
}

Assistant:

int X509V3_EXT_add_nconf_sk(const CONF *conf, const X509V3_CTX *ctx,
                            const char *section,
                            STACK_OF(X509_EXTENSION) **sk) {
  const STACK_OF(CONF_VALUE) *nval = NCONF_get_section(conf, section);
  if (nval == NULL) {
    return 0;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(nval, i);
    X509_EXTENSION *ext = X509V3_EXT_nconf(conf, ctx, val->name, val->value);
    int ok = ext != NULL &&  //
             (sk == NULL || X509v3_add_ext(sk, ext, -1) != NULL);
    X509_EXTENSION_free(ext);
    if (!ok) {
      return 0;
    }
  }
  return 1;
}